

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O1

void int_trp_assert_error(char *exp,char *file,int line)

{
  undefined8 local_30;
  undefined8 local_28;
  
  trun::TestRunner::GetCurrentTestModule();
  trun::TestResponseProxy::AssertError((TestResponseProxy *)(local_30 + 0xa0),exp,file,line);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

static void int_trp_assert_error(const char *exp, const char *file, int line) {
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().AssertError(exp, file, line);
}